

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

aiMesh * __thiscall
Assimp::X3DImporter::GeometryHelper_MakeMesh
          (X3DImporter *this,vector<int,_std::allocator<int>_> *pCoordIdx,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertices)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  size_type sVar4;
  DeadlyImportError *this_00;
  aiMesh *this_01;
  _List_node_base *p_Var5;
  ulong uVar6;
  size_type *psVar7;
  reference o;
  aiVector3D *paVar8;
  reference paVar9;
  aiFace *paVar10;
  ulong uVar11;
  aiVector3t<float> *local_120;
  aiFace *local_f0;
  _List_const_iterator<aiVector3t<float>_> local_a8;
  ulong local_a0;
  size_t i_1;
  const_iterator vit;
  size_t i;
  size_t ts;
  aiMesh *tmesh;
  string local_70;
  uint local_3c;
  undefined1 local_38 [4];
  uint prim_type;
  vector<aiFace,_std::allocator<aiFace>_> faces;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertices_local;
  vector<int,_std::allocator<int>_> *pCoordIdx_local;
  X3DImporter *this_local;
  
  faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)pVertices;
  std::vector<aiFace,_std::allocator<aiFace>_>::vector
            ((vector<aiFace,_std::allocator<aiFace>_> *)local_38);
  local_3c = 0;
  GeometryHelper_CoordIdxStr2FacesArr
            (this,pCoordIdx,(vector<aiFace,_std::allocator<aiFace>_> *)local_38,&local_3c);
  sVar4 = std::vector<aiFace,_std::allocator<aiFace>_>::size
                    ((vector<aiFace,_std::allocator<aiFace>_> *)local_38);
  if (sVar4 == 0) {
    tmesh._6_1_ = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Failed to create mesh, faces list is empty.",
               (allocator<char> *)((long)&tmesh + 7));
    DeadlyImportError::DeadlyImportError(this_00,&local_70);
    tmesh._6_1_ = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  this_01 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_01);
  p_Var5 = (_List_node_base *)
           std::vector<aiFace,_std::allocator<aiFace>_>::size
                     ((vector<aiFace,_std::allocator<aiFace>_> *)local_38);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = p_Var5;
  uVar6 = SUB168(auVar1 * ZEXT816(0x10),0);
  uVar11 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar11 = 0xffffffffffffffff;
  }
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  psVar7 = (size_type *)operator_new__(uVar11);
  *psVar7 = (size_type)p_Var5;
  paVar10 = (aiFace *)(psVar7 + 1);
  if (p_Var5 != (_List_node_base *)0x0) {
    local_f0 = paVar10;
    do {
      aiFace::aiFace(local_f0);
      local_f0 = local_f0 + 1;
    } while (local_f0 != paVar10 + (long)p_Var5);
  }
  this_01->mFaces = paVar10;
  this_01->mNumFaces = (uint)p_Var5;
  for (vit._M_node = (_List_node_base *)0x0; vit._M_node < p_Var5;
      vit._M_node = (_List_node_base *)((long)&(vit._M_node)->_M_next + 1)) {
    o = std::vector<aiFace,_std::allocator<aiFace>_>::at
                  ((vector<aiFace,_std::allocator<aiFace>_> *)local_38,(size_type)vit._M_node);
    aiFace::operator=(this_01->mFaces + (long)vit._M_node,o);
  }
  i_1 = (size_t)std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                          ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
  sVar4 = std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                    ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar4;
  uVar6 = SUB168(auVar2 * ZEXT816(0xc),0);
  if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  paVar8 = (aiVector3D *)operator_new__(uVar6);
  if (sVar4 != 0) {
    local_120 = paVar8;
    do {
      aiVector3t<float>::aiVector3t(local_120);
      local_120 = local_120 + 1;
    } while (local_120 != paVar8 + sVar4);
  }
  this_01->mVertices = paVar8;
  this_01->mNumVertices = (uint)sVar4;
  for (local_a0 = 0; local_a0 < sVar4; local_a0 = local_a0 + 1) {
    local_a8._M_node =
         (_List_node_base *)
         std::_List_const_iterator<aiVector3t<float>_>::operator++
                   ((_List_const_iterator<aiVector3t<float>_> *)&i_1,0);
    paVar9 = std::_List_const_iterator<aiVector3t<float>_>::operator*(&local_a8);
    paVar8 = this_01->mVertices + local_a0;
    fVar3 = paVar9->y;
    paVar8->x = paVar9->x;
    paVar8->y = fVar3;
    paVar8->z = paVar9->z;
  }
  this_01->mPrimitiveTypes = local_3c;
  std::vector<aiFace,_std::allocator<aiFace>_>::~vector
            ((vector<aiFace,_std::allocator<aiFace>_> *)local_38);
  return this_01;
}

Assistant:

aiMesh* X3DImporter::GeometryHelper_MakeMesh(const std::vector<int32_t>& pCoordIdx, const std::list<aiVector3D>& pVertices) const
{
    std::vector<aiFace> faces;
    unsigned int prim_type = 0;

	// create faces array from input string with vertices indices.
	GeometryHelper_CoordIdxStr2FacesArr(pCoordIdx, faces, prim_type);
    if ( !faces.size() )
    {
        throw DeadlyImportError( "Failed to create mesh, faces list is empty." );
    }

	//
	// Create new mesh and copy geometry data.
	//
    aiMesh *tmesh = new aiMesh;
    size_t ts = faces.size();
	// faces
	tmesh->mFaces = new aiFace[ts];
	tmesh->mNumFaces = static_cast<unsigned int>(ts);
	for(size_t i = 0; i < ts; i++) tmesh->mFaces[i] = faces.at(i);

	// vertices
	std::list<aiVector3D>::const_iterator vit = pVertices.begin();

	ts = pVertices.size();
	tmesh->mVertices = new aiVector3D[ts];
	tmesh->mNumVertices = static_cast<unsigned int>(ts);
    for ( size_t i = 0; i < ts; i++ )
    {
        tmesh->mVertices[ i ] = *vit++;
    }

	// set primitives type and return result.
	tmesh->mPrimitiveTypes = prim_type;

	return tmesh;
}